

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_decoder_factory.h
# Opt level: O2

unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
 __thiscall
draco::CreatePredictionSchemeForDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>
          (draco *this,PredictionSchemeMethod method,int att_id,PointCloudDecoder *decoder,
          PredictionSchemeWrapDecodingTransform<int,_int> *transform)

{
  ushort uVar1;
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> attribute;
  int iVar2;
  PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
  *this_00;
  MeshDecoder *mesh_decoder;
  
  if (method == PREDICTION_NONE) {
    this_00 = (PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
               *)0x0;
  }
  else {
    attribute._M_t.
    super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
    super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
         (decoder->point_cloud_->attributes_).
         super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[att_id]._M_t.
         super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>.
         _M_t;
    iVar2 = (*decoder->_vptr_PointCloudDecoder[2])(decoder);
    if (iVar2 == 1) {
      uVar1._0_1_ = decoder->version_major_;
      uVar1._1_1_ = decoder->version_minor_;
      CreateMeshPredictionScheme<draco::MeshDecoder,draco::PredictionSchemeDecoder<int,draco::PredictionSchemeWrapDecodingTransform<int,int>>,draco::MeshPredictionSchemeDecoderFactory<int>>
                (this,(MeshDecoder *)decoder,method,att_id,transform,uVar1 << 8 | uVar1 >> 8);
      if (*(long *)this != 0) {
        return (__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>,_true,_true>
                )(__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>,_true,_true>
                  )this;
      }
      std::
      unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
      ::~unique_ptr((unique_ptr<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>_>
                     *)this);
    }
    this_00 = (PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
               *)operator_new(0x40);
    PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>::
    PredictionSchemeDeltaDecoder
              (this_00,(PointAttribute *)
                       attribute._M_t.
                       super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                       .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl,transform
              );
  }
  *(PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_> **)
   this = this_00;
  return (__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>,_true,_true>
          )(__uniq_ptr_data<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>,_std::default_delete<draco::PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>
CreatePredictionSchemeForDecoder(PredictionSchemeMethod method, int att_id,
                                 const PointCloudDecoder *decoder,
                                 const TransformT &transform) {
  if (method == PREDICTION_NONE) {
    return nullptr;
  }
  const PointAttribute *const att = decoder->point_cloud()->attribute(att_id);
  if (decoder->GetGeometryType() == TRIANGULAR_MESH) {
    // Cast the decoder to mesh decoder. This is not necessarily safe if there
    // is some other decoder decides to use TRIANGULAR_MESH as the return type,
    // but unfortunately there is not nice work around for this without using
    // RTTI (double dispatch and similar concepts will not work because of the
    // template nature of the prediction schemes).
    const MeshDecoder *const mesh_decoder =
        static_cast<const MeshDecoder *>(decoder);

    auto ret = CreateMeshPredictionScheme<
        MeshDecoder, PredictionSchemeDecoder<DataTypeT, TransformT>,
        MeshPredictionSchemeDecoderFactory<DataTypeT>>(
        mesh_decoder, method, att_id, transform, decoder->bitstream_version());
    if (ret) {
      return ret;
    }
    // Otherwise try to create another prediction scheme.
  }
  // Create delta decoder.
  return std::unique_ptr<PredictionSchemeDecoder<DataTypeT, TransformT>>(
      new PredictionSchemeDeltaDecoder<DataTypeT, TransformT>(att, transform));
}